

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::FormatDeathTestOutput(string *__return_storage_ptr__,string *output)

{
  long lVar1;
  long in_FS_OFFSET;
  size_t line_end;
  size_t at;
  string *output_local;
  string *ret;
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    lVar1 = std::__cxx11::string::find((char)output,10);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[  DEATH   ] ");
    if (lVar1 == -1) break;
    std::__cxx11::string::substr((ulong)&ret,(ulong)output);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&ret);
    std::__cxx11::string::~string((string *)&ret);
  }
  std::__cxx11::string::substr((ulong)local_30,(ulong)output);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_30);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static ::std::string FormatDeathTestOutput(const ::std::string& output) {
			::std::string ret;
			for (size_t at = 0; ; ) {
				const size_t line_end = output.find('\n', at);
				ret += "[  DEATH   ] ";
				if (line_end == ::std::string::npos) {
					ret += output.substr(at);
					break;
				}
				ret += output.substr(at, line_end + 1 - at);
				at = line_end + 1;
			}
			return ret;
		}